

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

int iq1_find_best_neighbour2
              (uint16_t *neighbours,uint64_t *grid,float *xval,float *weight,float scale,float *xg,
              int8_t *L,int ngrid)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  uint64_t *puVar8;
  int line;
  long lVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  undefined1 auVar12 [16];
  undefined1 auVar19 [16];
  ushort uVar33;
  ushort uVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  float fVar43;
  float d2;
  float fVar44;
  float fVar45;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 uVar20;
  
  uVar10 = *neighbours;
  if (uVar10 == 0) {
    pcVar7 = "num_neighbors > 0";
    line = 0xfd6;
LAB_0013bef5:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-quants.c"
               ,line,"GGML_ASSERT(%s) failed",pcVar7);
  }
  lVar1 = (ulong)uVar10 + 1;
  uVar4 = 0xffffffff;
  fVar43 = 3.4028235e+38;
  lVar5 = 1;
  do {
    fVar45 = 0.0;
    lVar9 = 0;
    do {
      cVar2 = *(char *)((long)grid + lVar9 + (ulong)neighbours[lVar5] * 8);
      fVar44 = xg[(short)((uint)(int)(short)((short)cVar2 +
                                             (short)(((int)cVar2 - 1U & 0xffff) >> 0xf) + -1) >> 1)]
               * scale - xval[lVar9];
      fVar45 = fVar45 + weight[lVar9] * fVar44 * fVar44;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 8);
    if (fVar45 < fVar43) {
      uVar4 = (ulong)neighbours[lVar5];
    }
    uVar3 = (uint)uVar4;
    if (fVar43 <= fVar45) {
      fVar45 = fVar43;
    }
    fVar43 = fVar45;
    lVar5 = lVar5 + 1;
  } while (lVar5 != lVar1);
  if ((int)uVar3 < 0) {
    uVar4 = 0xffffffff;
    uVar6 = 0;
    puVar8 = grid;
    do {
      fVar45 = 0.0;
      lVar5 = 0;
      do {
        fVar44 = xg[(short)((uint)(int)(short)((short)*(char *)((long)puVar8 + lVar5) +
                                               (short)(((int)*(char *)((long)puVar8 + lVar5) - 1U &
                                                       0xffff) >> 0xf) + -1) >> 1)] * scale +
                 -xval[uVar6];
        fVar45 = fVar45 + weight[lVar5] * fVar44 * fVar44;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      if (fVar45 < fVar43) {
        uVar4 = uVar6 & 0xffffffff;
      }
      uVar3 = (uint)uVar4;
      if (fVar43 <= fVar45) {
        fVar45 = fVar43;
      }
      uVar6 = uVar6 + 1;
      puVar8 = puVar8 + 1;
      fVar43 = fVar45;
    } while (uVar6 != 0x800);
    if ((int)uVar3 < 0) {
      puts("Oops, did not find grid point");
      printf("Have %d neighbours\n",(ulong)uVar10);
      lVar5 = 1;
      do {
        fVar43 = 0.0;
        lVar9 = 0;
        do {
          cVar2 = *(char *)((long)grid + lVar9 + (ulong)neighbours[lVar5] * 8);
          fVar43 = fVar43 + xval[lVar9] *
                            weight[lVar9] *
                            xg[(short)((uint)(int)(short)((short)cVar2 +
                                                          (short)(((int)cVar2 - 1U & 0xffff) >> 0xf)
                                                         + -1) >> 1)];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 8);
        printf("    neighbour %d: sumqx = %g sumq2 = %g\n",(double)fVar43);
        lVar5 = lVar5 + 1;
      } while (lVar5 != lVar1);
      pcVar7 = "grid_index >= 0";
      line = 0x1006;
      goto LAB_0013bef5;
    }
  }
  uVar4 = grid[uVar3];
  uVar20 = (undefined1)(uVar4 >> 0x38);
  auVar18._8_6_ = 0;
  auVar18._0_8_ = uVar4;
  auVar18[0xe] = uVar20;
  auVar18[0xf] = uVar20;
  uVar20 = (undefined1)(uVar4 >> 0x30);
  auVar17._14_2_ = auVar18._14_2_;
  auVar17._8_5_ = 0;
  auVar17._0_8_ = uVar4;
  auVar17[0xd] = uVar20;
  auVar16._13_3_ = auVar17._13_3_;
  auVar16._8_4_ = 0;
  auVar16._0_8_ = uVar4;
  auVar16[0xc] = uVar20;
  uVar20 = (undefined1)(uVar4 >> 0x28);
  auVar15._12_4_ = auVar16._12_4_;
  auVar15._8_3_ = 0;
  auVar15._0_8_ = uVar4;
  auVar15[0xb] = uVar20;
  auVar14._11_5_ = auVar15._11_5_;
  auVar14._8_2_ = 0;
  auVar14._0_8_ = uVar4;
  auVar14[10] = uVar20;
  uVar20 = (undefined1)(uVar4 >> 0x20);
  auVar13._10_6_ = auVar14._10_6_;
  auVar13[8] = 0;
  auVar13._0_8_ = uVar4;
  auVar13[9] = uVar20;
  auVar12._9_7_ = auVar13._9_7_;
  auVar12[8] = uVar20;
  auVar12._0_8_ = uVar4;
  uVar20 = (undefined1)(uVar4 >> 0x18);
  auVar19._8_8_ = auVar12._8_8_;
  auVar19[7] = uVar20;
  auVar19[6] = uVar20;
  uVar20 = (undefined1)(uVar4 >> 0x10);
  auVar19[5] = uVar20;
  auVar19[4] = uVar20;
  uVar20 = (undefined1)(uVar4 >> 8);
  auVar19[3] = uVar20;
  auVar19[2] = uVar20;
  auVar19[0] = (undefined1)uVar4;
  auVar19[1] = auVar19[0];
  auVar19 = psraw(auVar19,8);
  sVar35 = auVar19._0_2_ + -1;
  sVar36 = auVar19._2_2_ + -1;
  sVar37 = auVar19._4_2_ + -1;
  sVar38 = auVar19._6_2_ + -1;
  sVar39 = auVar19._8_2_ + -1;
  sVar40 = auVar19._10_2_ + -1;
  sVar41 = auVar19._12_2_ + -1;
  sVar42 = auVar19._14_2_ + -1;
  uVar10 = (ushort)(sVar35 - (sVar35 >> 0xf)) >> 1;
  uVar21 = (ushort)(sVar36 - (sVar36 >> 0xf)) >> 1;
  uVar23 = (ushort)(sVar37 - (sVar37 >> 0xf)) >> 1;
  uVar25 = (ushort)(sVar38 - (sVar38 >> 0xf)) >> 1;
  uVar27 = (ushort)(sVar39 - (sVar39 >> 0xf)) >> 1;
  uVar29 = (ushort)(sVar40 - (sVar40 >> 0xf)) >> 1;
  uVar31 = (ushort)(sVar41 - (sVar41 >> 0xf)) >> 1;
  uVar33 = (ushort)(sVar42 - (sVar42 >> 0xf)) >> 1;
  uVar11 = uVar10 & 0xff;
  uVar22 = uVar21 & 0xff;
  uVar24 = uVar23 & 0xff;
  uVar26 = uVar25 & 0xff;
  uVar28 = uVar27 & 0xff;
  uVar30 = uVar29 & 0xff;
  uVar32 = uVar31 & 0xff;
  uVar34 = uVar33 & 0xff;
  *(ulong *)L = CONCAT17((uVar34 != 0) * (uVar34 < 0x100) * (char)uVar33 - (0xff < uVar34),
                         CONCAT16((uVar32 != 0) * (uVar32 < 0x100) * (char)uVar31 - (0xff < uVar32),
                                  CONCAT15((uVar30 != 0) * (uVar30 < 0x100) * (char)uVar29 -
                                           (0xff < uVar30),
                                           CONCAT14((uVar28 != 0) * (uVar28 < 0x100) * (char)uVar27
                                                    - (0xff < uVar28),
                                                    CONCAT13((uVar26 != 0) * (uVar26 < 0x100) *
                                                             (char)uVar25 - (0xff < uVar26),
                                                             CONCAT12((uVar24 != 0) *
                                                                      (uVar24 < 0x100) *
                                                                      (char)uVar23 - (0xff < uVar24)
                                                                      ,CONCAT11((uVar22 != 0) *
                                                                                (uVar22 < 0x100) *
                                                                                (char)uVar21 -
                                                                                (0xff < uVar22),
                                                                                (uVar11 != 0) *
                                                                                (uVar11 < 0x100) *
                                                                                (char)uVar10 -
                                                                                (0xff < uVar11))))))
                                 ));
  return uVar3;
}

Assistant:

static int iq1_find_best_neighbour2(const uint16_t * GGML_RESTRICT neighbours, const uint64_t * GGML_RESTRICT grid,
        const float * GGML_RESTRICT xval, const float * GGML_RESTRICT weight, float scale, const float * GGML_RESTRICT xg, int8_t * GGML_RESTRICT L, int ngrid) {
    int num_neighbors = neighbours[0];
    GGML_ASSERT(num_neighbors > 0);
    float best_score = FLT_MAX;
    int grid_index = -1;
    for (int j = 1; j <= num_neighbors; ++j) {
        const int8_t * pg = (const int8_t *)(grid + neighbours[j]);
        float d2 = 0;
        for (int i = 0; i < 8; ++i) {
            float q = xg[(pg[i] - 1)/2];
            float w = weight[i];
            float diff = scale*q - xval[i];
            d2 += w*diff*diff;
        }
        if (d2 < best_score) {
            best_score = d2;
            grid_index = neighbours[j];
        }
    }
    if (grid_index < 0) {
        for (int i = 0; i < ngrid; ++i) {
            const int8_t * grid_i = (const int8_t *)(grid + i);
            float d2 = 0;
            for (int j = 0; j < 8; ++j) {
                float w = weight[j];
                float q = xg[(grid_i[j] - 1)/2];
                float diff = scale*q - xval[i];
                d2 += w*diff*diff;
            }
            if (d2 < best_score) {
                best_score = d2;
                grid_index = i;
            }
        }
    }
    if (grid_index < 0) {
        printf("Oops, did not find grid point\n");
        printf("Have %d neighbours\n", num_neighbors);
        for (int j = 1; j <= num_neighbors; ++j) {
            const int8_t * pg = (const int8_t *)(grid + neighbours[j]);
            float sumqx = 0, sumq2 = 0;
            for (int i = 0; i < 8; ++i) {
                float q = xg[(pg[i] - 1)/2];
                float w = weight[i];
                sumqx += w*q*xval[i];
                sumq2 += w*q*q;
            }
            printf("    neighbour %d: sumqx = %g sumq2 = %g\n", j, (double)sumqx, (double)sumq2);
        }
    }
    GGML_ASSERT(grid_index >= 0);
    const int8_t * pg = (const int8_t *)(grid + grid_index);
    for (int i = 0; i < 8; ++i) L[i] = (pg[i] - 1)/2;
    return grid_index;
}